

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger base_call_method_impl(HSQUIRRELVM v,bool safe)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  SQObjectType type;
  undefined4 uVar3;
  SQObjectType type_00;
  undefined8 uVar4;
  SQTable *pSVar5;
  SQTable *this;
  undefined1 uVar6;
  undefined3 uVar7;
  bool bVar8;
  ulong uVar9;
  SQObjectPtr *pSVar10;
  long lVar11;
  SQRESULT SVar12;
  SQChar *pSVar13;
  char *__format;
  uint uVar14;
  int32_t i;
  bool t;
  SQObjectPtr ret;
  sqvector<SQObjectPtr,_unsigned_int> args;
  bool s;
  SQObjectValue SStack_450;
  SQObjectPtr callee;
  SQChar message [1024];
  
  memset(message,0,0x400);
  uVar9 = sq_gettop(v);
  uVar14 = (uint)uVar9;
  if ((int)uVar14 < 3) {
    if (!safe) {
      snprintf(message,0x400,
               "\'__call_method(...)\' recieves at least 2 arguments (%d), object to method on and method\'s name"
               ,uVar9 & 0xffffffff);
      goto LAB_0011fb10;
    }
    uVar9 = (ulong)(int)uVar14;
    goto LAB_0011fad8;
  }
  pSVar10 = stack_get(v,2);
  type = (pSVar10->super_SQObject)._type;
  uVar4 = *(undefined8 *)&(pSVar10->super_SQObject)._flags;
  uVar3 = *(undefined4 *)((long)&(pSVar10->super_SQObject)._unVal + 4);
  pSVar10 = stack_get(v,3);
  type_00 = (pSVar10->super_SQObject)._type;
  if (type_00 == OT_STRING) {
    pSVar5 = (pSVar10->super_SQObject)._unVal.pTable;
    lVar11 = 0xe8;
    if (((type == OT_BOOL) || (type == OT_INTEGER)) || (type == OT_FLOAT)) {
LAB_0011fb60:
      this = *(SQTable **)((long)&v->_sharedstate->_alloc_ctx + lVar11);
      callee.super_SQObject._unVal.pTable = (SQTable *)0x0;
      callee.super_SQObject._type = OT_NULL;
      callee.super_SQObject._flags = '\0';
      callee.super_SQObject._5_3_ = 0;
      args._vals = (SQObjectPtr *)
                   CONCAT44(*(undefined4 *)&(pSVar10->super_SQObject)._flags,0x8000010);
      pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      args._alloc_ctx = (SQAllocContext)pSVar5;
      bVar8 = SQTable::Get(this,(SQObjectPtr *)&args,&callee);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&args);
      if (bVar8) {
        args._alloc_ctx = v->_sharedstate->_alloc_ctx;
        args._vals = (SQObjectPtr *)0x0;
        args._size = 0;
        args._allocated = 0;
        sqvector<SQObjectPtr,_unsigned_int>::_realloc(&args,uVar14 - 2);
        ret.super_SQObject._4_4_ = SUB84(uVar4,0);
        ret.super_SQObject._unVal.fFloat = (SQFloat)((ulong)uVar4 >> 0x20);
        if ((type >> 0x1b & 1) != 0) {
          plVar2 = (long *)(CONCAT44(uVar3,ret.super_SQObject._unVal.fFloat) + 8);
          *plVar2 = *plVar2 + 1;
        }
        ret.super_SQObject._type = type;
        ret.super_SQObject._unVal.nInteger._4_4_ = uVar3;
        sqvector<SQObjectPtr,_unsigned_int>::push_back(&args,&ret);
        SQObjectPtr::~SQObjectPtr(&ret);
        for (uVar9 = 4; uVar9 <= (uVar14 & 0x7fffffff); uVar9 = uVar9 + 1) {
          pSVar10 = stack_get(v,uVar9);
          _s = (pSVar10->super_SQObject)._type;
          uVar6 = (pSVar10->super_SQObject)._flags;
          uVar7 = *(undefined3 *)&(pSVar10->super_SQObject).field_0x5;
          unique0x100003a6 = CONCAT31(uVar7,uVar6);
          SStack_450 = (SQObjectValue)(pSVar10->super_SQObject)._unVal.pTable;
          ret.super_SQObject._unVal.fFloat = SStack_450._0_4_;
          ret.super_SQObject._unVal.nInteger._4_4_ = (undefined4)((ulong)SStack_450 >> 0x20);
          if ((_s & 0x8000000) != 0) {
            pSVar1 = &((SStack_450.pTable)->super_SQDelegable).super_SQCollectable.
                      super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 + 1;
          }
          ret.super_SQObject._type = _s;
          ret.super_SQObject._4_4_ = unique0x100003a6;
          sqvector<SQObjectPtr,_unsigned_int>::push_back(&args,(SQObjectPtr *)&s);
          SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&s);
        }
        lVar11 = 0;
        for (uVar9 = 0; uVar9 < (args._16_8_ & 0xffffffff); uVar9 = uVar9 + 1) {
          SQVM::Push(v,(SQObjectPtr *)((long)&((args._vals)->super_SQObject)._type + lVar11));
          lVar11 = lVar11 + 0x10;
        }
        ret.super_SQObject._flags = '\0';
        ret.super_SQObject._5_3_ = 0;
        ret.super_SQObject._unVal.fFloat = 0.0;
        ret.super_SQObject._unVal.nInteger._4_4_ = 0;
        ret.super_SQObject._type = OT_NULL;
        bVar8 = SQVM::CallNative(v,callee.super_SQObject._unVal.pNativeClosure,(ulong)(uVar14 - 2),
                                 v->_stackbase + (ulong)(uVar14 & 0x7fffffff),&ret,-1,&s,&t);
        if (bVar8) {
          SQVM::Pop(v,(ulong)(uVar14 & 0x7fffffff));
          SQVM::Push(v,&ret);
          SVar12 = 1;
        }
        else {
          SVar12 = -1;
        }
        SQObjectPtr::~SQObjectPtr(&ret);
        sqvector<SQObjectPtr,_unsigned_int>::~sqvector(&args);
      }
      else if (safe) {
        SQVM::Pop(v,(ulong)(uVar14 & 0x7fffffff));
        SQVM::PushNull(v);
        SVar12 = 1;
      }
      else {
        pSVar13 = IdType2Name(type);
        snprintf(message,0x400,"function \'%s\' not found in \'%s\' delegates",&pSVar5->_firstfree,
                 pSVar13);
        SVar12 = sq_throwerror(v,message);
      }
      SQObjectPtr::~SQObjectPtr(&callee);
      return SVar12;
    }
    if (type == OT_INSTANCE) {
      lVar11 = 0x138;
      goto LAB_0011fb60;
    }
    if (type == OT_ARRAY) {
      lVar11 = 200;
      goto LAB_0011fb60;
    }
    if ((type == OT_CLOSURE) || (type == OT_NATIVECLOSURE)) {
      lVar11 = 0x108;
      goto LAB_0011fb60;
    }
    if (type == OT_GENERATOR) {
      lVar11 = 0xf8;
      goto LAB_0011fb60;
    }
    if (type == OT_THREAD) {
      lVar11 = 0x118;
      goto LAB_0011fb60;
    }
    if (type == OT_CLASS) {
      lVar11 = 0x128;
      goto LAB_0011fb60;
    }
    if (type == OT_WEAKREF) {
      lVar11 = 0x148;
      goto LAB_0011fb60;
    }
    if (type == OT_TABLE) {
      lVar11 = 0xb8;
      goto LAB_0011fb60;
    }
    if (type == OT_USERDATA) {
      lVar11 = 0x158;
      goto LAB_0011fb60;
    }
    if (type == OT_STRING) {
      lVar11 = 0xd8;
      goto LAB_0011fb60;
    }
    if (!safe) {
      pSVar13 = IdType2Name(type);
      __format = "unsupported object type \'%s\' as receiver in \'__call_method(...)\' function";
      goto LAB_0011faf9;
    }
  }
  else if (!safe) {
    pSVar13 = IdType2Name(type_00);
    __format = "\'__call_method(...)\' expects 2nd argument to be string, actual \'%s\'";
LAB_0011faf9:
    snprintf(message,0x400,__format,pSVar13);
LAB_0011fb10:
    SVar12 = sq_throwerror(v,message);
    return SVar12;
  }
  uVar9 = (ulong)(uVar14 & 0x7fffffff);
LAB_0011fad8:
  SQVM::Pop(v,uVar9);
  SQVM::PushNull(v);
  return 1;
}

Assistant:

static SQInteger base_call_method_impl(HSQUIRRELVM v, bool safe)
{
    SQChar message[1024] = {0};
    int32_t nArgs = sq_gettop(v);

    if (nArgs < 3)
    {
        if (safe)
        {
            v->Pop(nArgs);
            v->PushNull();
            return 1;
        }
        snprintf(message, sizeof message, _SC("'__call_method(...)' recieves at least 2 arguments (%d), object to method on and method's name"), nArgs);
        return sq_throwerror(v, message);
    }

    SQObject obj = stack_get(v, 2);
    SQObject name = stack_get(v, 3);

    if (!sq_isstring(name))
    {
        if (safe)
        {
            v->Pop(nArgs);
            v->PushNull();
            return 1;
        }
        snprintf(message, sizeof message, _SC("'__call_method(...)' expects 2nd argument to be string, actual '%s'"), IdType2Name(sq_type(name)));
        return sq_throwerror(v, message);
    }

    SQObject delegates;
    SQObjectType type = sq_type(obj);
    switch (type)
    {
    case OT_INTEGER:
    case OT_FLOAT:
    case OT_BOOL:
        delegates = _ss(v)->_number_default_delegate;
        break;
    case OT_STRING:
        delegates = _ss(v)->_string_default_delegate;
        break;
    case OT_TABLE:
        delegates = _ss(v)->_table_default_delegate;
        break;
    case OT_ARRAY:
        delegates = _ss(v)->_array_default_delegate;
        break;
    case OT_USERDATA:
        delegates = _ss(v)->_userdata_default_delegate;
        break;
    case OT_CLOSURE:
    case OT_NATIVECLOSURE:
        delegates = _ss(v)->_closure_default_delegate;
        break;
    case OT_GENERATOR:
        delegates = _ss(v)->_generator_default_delegate;
        break;
    case OT_THREAD:
        delegates = _ss(v)->_thread_default_delegate;
        break;
    case OT_CLASS:
        delegates = _ss(v)->_class_default_delegate;
        break;
    case OT_INSTANCE:
        delegates = _ss(v)->_instance_default_delegate;
        break;
    case OT_WEAKREF:
        delegates = _ss(v)->_weakref_default_delegate;
        break;
    default:
        if (safe)
        {
            v->Pop(nArgs);
            v->PushNull();
            return 1;
        }
        snprintf(message, sizeof message, _SC("unsupported object type '%s' as receiver in '__call_method(...)' function"), IdType2Name(type));
        return sq_throwerror(v, message);
    }

    assert(sq_istable(delegates));

    SQObjectPtr callee;
    if (!_table(delegates)->Get(name, callee))
    {
        if (safe)
        {
            v->Pop(nArgs);
            v->PushNull();
            return 1;
        }
        else
        {
            snprintf(message, sizeof message, _SC("function '%s' not found in '%s' delegates"), _stringval(name), IdType2Name(type));
            return sq_throwerror(v, message);
        }
    }

    assert(sq_isnativeclosure(callee));

    sqvector<SQObjectPtr> args(_ss(v)->_alloc_ctx);

    args.reserve(nArgs - 2);
    args.push_back(obj);

    for (int32_t i = 4; i <= nArgs; ++i) // skip reciever + name
    {
        SQObject arg = stack_get(v, i);
        args.push_back(arg);
    }

    for (int32_t i = 0; i < args.size(); ++i)
    {
        v->Push(args[i]);
    }

    bool s, t;
    SQObjectPtr ret;
    if (!v->CallNative(_nativeclosure(callee), nArgs - 2, v->_stackbase + nArgs, ret, -1, s, t))
    {
        return SQ_ERROR;
    }

    v->Pop(nArgs);
    v->Push(ret);
    return 1;
}